

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *paVar1;
  undefined1 *this;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *pvVar7;
  value_type local_ad4 [2];
  value_type local_acc [2];
  value_type local_ac4;
  value_type local_ac0;
  value_type local_abc [2];
  value_type local_ab4 [2];
  value_type local_aac [2];
  value_type local_aa4 [2];
  value_type local_a9c [2];
  value_type local_a94 [2];
  allocator<int> local_a89;
  deque<int,_ft::allocator<int>_> local_a88;
  undefined1 local_a10 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ftBar;
  deque<int,_ft::allocator<int>_> local_990;
  undefined1 local_918 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ftFoo;
  queue<int,_std::deque<int,_std::allocator<int>_>_> stdBar;
  queue<int,_std::deque<int,_std::allocator<int>_>_> stdFoo;
  queue<int,_ft::list<int,_ft::allocator<int>_>_> ft_4;
  queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> std_4;
  undefined1 local_7c0 [8];
  list<int,_ft::allocator<int>_> ftL;
  undefined1 local_798 [8];
  list<int,_std::allocator<int>_> stdL;
  deque<int,_ft::allocator<int>_> local_778;
  undefined1 local_700 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft_3;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_3;
  value_type local_630 [4];
  value_type local_620 [5];
  allocator<int> local_609;
  deque<int,_ft::allocator<int>_> local_608;
  undefined1 local_590 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ftCopy_1;
  queue<int,_std::deque<int,_std::allocator<int>_>_> stdCopy_1;
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft_2;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_2;
  int local_3f8;
  allocator<int> local_3f1;
  int i_1;
  undefined1 local_378 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ftCopy;
  queue<int,_std::deque<int,_std::allocator<int>_>_> stdCopy;
  int i;
  undefined1 local_230 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft_1;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std_1;
  allocator<int> local_151;
  deque<int,_ft::allocator<int>_> local_150;
  undefined1 local_d8 [8];
  queue<int,_ft::deque<int,_ft::allocator<int>_>_> ft;
  queue<int,_std::deque<int,_std::allocator<int>_>_> std;
  
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&ft.c.field_0x70);
  ::ft::allocator<int>::allocator(&local_151);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_150,&local_151);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_d8,&local_150);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_150);
  ::ft::allocator<int>::~allocator(&local_151);
  bVar2 = ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70);
  if (bVar2) {
    poVar3 = ::std::operator<<((ostream *)&::std::cout,"std is empty");
    ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  }
  bVar2 = ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::empty
                    ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_d8);
  if (bVar2) {
    poVar3 = ::std::operator<<((ostream *)&::std::cout," ft is empty");
    ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  }
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  sVar4 = ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::size
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  sVar5 = ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::size
                    ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_d8);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar5);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_d8);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&ft_1.c.field_0x70);
  paVar1 = (allocator<int> *)
           ((long)&stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + 7);
  ::ft::allocator<int>::allocator(paVar1);
  ::ft::deque<int,_ft::allocator<int>_>::deque((deque<int,_ft::allocator<int>_> *)&i,paVar1);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230,(container_type *)&i);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)&i);
  ::ft::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 7));
  for (stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node._0_4_ = 1;
      (int)stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node < 6;
      stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._0_4_ =
           (int)stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node + 1) {
    ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_1.c.field_0x70,
               (value_type *)
               &stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
              ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230,
               (value_type *)
               &stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
  }
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  sVar4 = ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::size
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_1.c.field_0x70);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  sVar5 = ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::size
                    ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar5);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"front of std: ");
  pvVar6 = ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                     ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_1.c.field_0x70);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,*pvVar6);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"back of std: ");
  pvVar6 = ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::back
                     ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_1.c.field_0x70);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,*pvVar6);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"front of ft: ");
  pvVar7 = ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::front
                     ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,*pvVar7);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"back of ft: ");
  pvVar7 = ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::back
                     ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,*pvVar7);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_1.c.field_0x70,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230,"ft");
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_230);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_1.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&ftCopy.c.field_0x70);
  ::ft::allocator<int>::allocator(&local_3f1);
  ::ft::deque<int,_ft::allocator<int>_>::deque((deque<int,_ft::allocator<int>_> *)&i_1,&local_3f1);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_378,(container_type *)&i_1);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)&i_1);
  ::ft::allocator<int>::~allocator(&local_3f1);
  for (local_3f8 = 1; local_3f8 < 5; local_3f8 = local_3f8 + 1) {
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node._4_4_ = local_3f8 * 10;
    ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy.c.field_0x70,
               (value_type *)
               ((long)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4));
    std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node._0_4_ = local_3f8 * 10;
    ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
              ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_378,
               (value_type *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
  }
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_2.c.field_0x70,
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy.c.field_0x70);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &stdCopy_1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,
             (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_378);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_2.c.field_0x70,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &stdCopy_1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,"ft");
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &stdCopy_1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_2.c.field_0x70);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_378);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&ftCopy_1.c.field_0x70);
  ::ft::allocator<int>::allocator(&local_609);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_608,&local_609);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590,&local_608);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_608);
  ::ft::allocator<int>::~allocator(&local_609);
  local_620[4] = 0xe;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70,
             local_620 + 4);
  local_620[3] = 8;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70,
             local_620 + 3);
  local_620[2] = 0x10;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70,
             local_620 + 2);
  local_620[1] = 10;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70,
             local_620 + 1);
  local_620[0] = 0x14;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70,local_620)
  ;
  local_630[3] = 0xe;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590,local_630 + 3);
  local_630[2] = 8;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590,local_630 + 2);
  local_630[1] = 0x10;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590,local_630 + 1);
  local_630[0] = 10;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590,local_630);
  std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._4_4_ = 0x14;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590,
             (value_type *)
             ((long)&std_3.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4));
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&ft_3.c.field_0x70);
  paVar1 = (allocator<int> *)
           ((long)&stdL.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 7);
  ::ft::allocator<int>::allocator(paVar1);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_778,paVar1);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_700,&local_778);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_778);
  ::ft::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&stdL.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 7));
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::operator=
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_3.c.field_0x70,
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::operator=
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_700,
             (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590);
  print<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_3.c.field_0x70,"std");
  print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_700,"ft");
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_700);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_3.c.field_0x70);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_590);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy_1.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ftL._28_4_ = 0x28;
  ::std::allocator<int>::allocator((allocator<int> *)&ftL.field_0x1b);
  ::std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)local_798,4,(value_type *)&ftL.field_0x1c,
             (allocator_type *)&ftL.field_0x1b);
  ::std::allocator<int>::~allocator((allocator<int> *)&ftL.field_0x1b);
  paVar1 = (allocator<int> *)
           ((long)&std_4.c.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 7);
  ::ft::allocator<int>::allocator(paVar1);
  ::ft::list<int,_ft::allocator<int>_>::list<int>
            ((list<int,_ft::allocator<int>_> *)local_7c0,4,0x28,paVar1);
  ::ft::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&std_4.c.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 7
             ));
  ::std::queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_>::queue
            ((queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *)&ft_4.c.field_0x18,
             (list<int,_std::allocator<int>_> *)local_798);
  ::ft::queue<int,_ft::list<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::list<int,_ft::allocator<int>_>_> *)
             &stdFoo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(container_type *)local_7c0);
  print<std::queue<int,std::__cxx11::list<int,std::allocator<int>>>>
            ((queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *)&ft_4.c.field_0x18,"std")
  ;
  print<ft::queue<int,ft::list<int,ft::allocator<int>>>>
            ((queue<int,_ft::list<int,_ft::allocator<int>_>_> *)
             &stdFoo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ft");
  ::ft::queue<int,_ft::list<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::list<int,_ft::allocator<int>_>_> *)
             &stdFoo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *)&ft_4.c.field_0x18);
  ::ft::list<int,_ft::allocator<int>_>::~list((list<int,_ft::allocator<int>_> *)local_7c0);
  ::std::__cxx11::list<int,_std::allocator<int>_>::~list
            ((list<int,_std::allocator<int>_> *)local_798);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&ftFoo.c.field_0x70);
  this = &ftBar.c.field_0x77;
  ::ft::allocator<int>::allocator((allocator<int> *)this);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_990,(allocator_type *)this);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,&local_990);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_990);
  ::ft::allocator<int>::~allocator((allocator<int> *)&ftBar.c.field_0x77);
  ::ft::allocator<int>::allocator(&local_a89);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_a88,&local_a89);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,&local_a88);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_a88);
  ::ft::allocator<int>::~allocator(&local_a89);
  local_a94[1] = 4;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,local_a94 + 1);
  local_a94[0] = 4;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_a94);
  local_a9c[1] = 4;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,local_a9c + 1);
  local_a9c[0] = 4;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,local_a9c);
  local_aa4[1] = 0xf;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,local_aa4 + 1);
  local_aa4[0] = 0xf;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_aa4);
  local_aac[1] = 0xf;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,local_aac + 1);
  local_aac[0] = 0xf;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,local_aac);
  local_ab4[1] = 0x19;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,local_ab4 + 1);
  local_ab4[0] = 0x19;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_ab4);
  local_abc[1] = 0x19;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,local_abc + 1);
  local_abc[0] = 0x19;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,local_abc);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,"ftFoo",
             (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,"ftBar");
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  local_ac0 = 0x21;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,&local_ac0);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::pop
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918);
  local_ac4 = 0x21;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,&local_ac4);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,"ftFoo",
             (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,"ftBar");
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70);
  local_acc[1] = 0x21;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_acc + 1
            );
  local_acc[0] = 2;
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_acc);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::pop
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10);
  local_ad4[1] = 0x21;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,local_ad4 + 1);
  local_ad4[0] = 2;
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,local_ad4);
  relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,"stdBar");
  relational_operator<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918,"ftFoo",
             (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10,"ftBar");
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a10);
  ::ft::queue<int,_ft::deque<int,_ft::allocator<int>_>_>::~queue
            ((queue<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_918);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70);
  ::std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  return 0;
}

Assistant:

int 	main() {
	{ // constructors and some basic functions
		std::queue<int>	std;
		ft::queue<int>	ft;

		if (std.empty()) std::cout << "std is empty" << std::endl;
		if (ft.empty()) std::cout << " ft is empty" << std::endl;

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;
	}

	std::cout << "---" << std::endl;

	{ // push pop and element access at the front and back
		std::queue<int>	std;
		ft::queue<int>	ft;

		for (int i = 1; i <= 5; ++i) {
			std.push(i);
			ft.push(i);
		}

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;

		std::cout << "front of std: " << std.front() << std::endl;
		std::cout << "back of std: " << std.back() << std::endl;
		std::cout << "front of ft: " << ft.front() << std::endl;
		std::cout << "back of ft: " << ft.back() << std::endl;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // copy constructor
		std::queue<int>	stdCopy;
		ft::queue<int>	ftCopy;

		for (int i = 1; i <= 4; ++i) {
			stdCopy.push(i * 10);
			ftCopy.push(i * 10);
		}

		std::queue<int>	std(stdCopy);
		ft::queue<int>	ft(ftCopy);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // assignment operator
		std::queue<int>	stdCopy;
		ft::queue<int>	ftCopy;

		stdCopy.push(14);
		stdCopy.push(8);
		stdCopy.push(16);
		stdCopy.push(10);
		stdCopy.push(20);

		ftCopy.push(14);
		ftCopy.push(8);
		ftCopy.push(16);
		ftCopy.push(10);
		ftCopy.push(20);


		std::queue<int>	std;
		ft::queue<int>	ft;

		std = stdCopy;
		ft = ftCopy;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // different underlying container
		std::list<int>	stdL(4, 40);
		ft::list<int>	ftL(4, 40);

		std::queue<int, std::list<int> >	std(stdL);
		ft::queue<int, ft::list<int> >		ft(ftL);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // relational operators
		std::queue<int>	stdFoo, stdBar;
		ft::queue<int>	ftFoo, ftBar;

		stdFoo.push(4);
		stdBar.push(4);
		ftFoo.push(4);
		ftBar.push(4);

		stdFoo.push(15);
		stdBar.push(15);
		ftFoo.push(15);
		ftBar.push(15);

		stdFoo.push(25);
		stdBar.push(25);
		ftFoo.push(25);
		ftBar.push(25);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdFoo.pop();
		stdFoo.push(33);
		ftFoo.pop();
		ftFoo.push(33);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdBar.pop();
		stdBar.push(33);
		stdBar.push(2);
		ftBar.pop();
		ftBar.push(33);
		ftBar.push(2);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);
	}
	return 0;
}